

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O1

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  
  iVar4 = run_container_cardinality(container1);
  iVar2 = container2->cardinality;
  if (iVar2 < iVar4) {
LAB_0011ccc2:
    bVar16 = false;
  }
  else {
    uVar6 = (ulong)container1->n_runs;
    bVar16 = (long)uVar6 < 1;
    if (0 < (long)uVar6) {
      puVar3 = container2->array;
      iVar4 = iVar2 + -1;
      iVar7 = -1;
      uVar10 = 0;
      do {
        uVar1 = container1->runs[uVar10].value;
        iVar5 = iVar7 + 1;
        iVar8 = iVar5;
        if ((iVar5 < iVar2) && (puVar3[iVar5] < uVar1)) {
          iVar8 = iVar7 + 2;
          iVar13 = 0;
          iVar15 = iVar4;
          if (iVar8 < iVar2) {
            iVar9 = 1;
            do {
              iVar13 = iVar9;
              iVar15 = iVar8;
              if (uVar1 <= puVar3[iVar8]) break;
              iVar13 = iVar9 * 2;
              iVar8 = iVar5 + iVar9 * 2;
              iVar9 = iVar13;
              iVar15 = iVar4;
            } while (iVar8 < iVar2);
            iVar13 = iVar13 >> 1;
          }
          iVar8 = iVar15;
          if (((puVar3[iVar15] != uVar1) && (iVar8 = iVar2, uVar1 <= puVar3[iVar15])) &&
             (iVar8 = iVar15, iVar13 + iVar5 + 1 != iVar15)) {
            iVar13 = iVar13 + iVar5;
            do {
              iVar8 = iVar13 + iVar15 >> 1;
              if (puVar3[iVar8] == uVar1) break;
              iVar9 = iVar8;
              if (puVar3[iVar8] < uVar1) {
                iVar9 = iVar15;
                iVar13 = iVar8;
              }
              iVar8 = iVar9;
              iVar15 = iVar9;
            } while (iVar13 + 1 != iVar9);
          }
        }
        uVar14 = (uint)container1->runs[uVar10].length;
        uVar12 = uVar1 + uVar14;
        iVar13 = iVar5;
        if ((iVar5 < iVar2) && (uVar11 = (ushort)uVar12, puVar3[iVar5] < uVar11)) {
          iVar7 = iVar7 + 2;
          iVar15 = 0;
          iVar9 = iVar4;
          if (iVar7 < iVar2) {
            iVar13 = 1;
            do {
              iVar9 = iVar7;
              iVar15 = iVar13;
              if (uVar11 <= puVar3[iVar7]) break;
              iVar15 = iVar13 * 2;
              iVar7 = iVar5 + iVar13 * 2;
              iVar9 = iVar4;
              iVar13 = iVar15;
            } while (iVar7 < iVar2);
            iVar15 = iVar15 >> 1;
          }
          iVar13 = iVar9;
          if (((puVar3[iVar9] != uVar11) && (iVar13 = iVar2, uVar11 <= puVar3[iVar9])) &&
             (iVar13 = iVar9, iVar15 + iVar5 + 1 != iVar9)) {
            iVar15 = iVar15 + iVar5;
            do {
              iVar13 = iVar15 + iVar9 >> 1;
              if (puVar3[iVar13] == uVar11) break;
              iVar7 = iVar13;
              if (puVar3[iVar13] < uVar11) {
                iVar7 = iVar9;
                iVar15 = iVar13;
              }
              iVar13 = iVar7;
              iVar9 = iVar7;
            } while (iVar15 + 1 != iVar7);
          }
        }
        iVar7 = iVar13;
        if (iVar7 == iVar2) {
          return false;
        }
        if (iVar7 - iVar8 != uVar14) {
          return false;
        }
        if ((puVar3[iVar8] != uVar1) || (uVar12 != puVar3[iVar7])) goto LAB_0011ccc2;
        uVar10 = uVar10 + 1;
        bVar16 = uVar6 <= uVar10;
      } while (uVar10 != uVar6);
    }
  }
  return bVar16;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}